

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

ON_XMLNode * __thiscall ON_XMLNode::operator=(ON_XMLNode *this,ON_XMLNode *src)

{
  ON_XMLNode *src_00;
  int iVar1;
  undefined4 extraout_var;
  ON_XMLProperty *pOVar2;
  ON_XMLNode *this_00;
  recursive_mutex *__mutex;
  ON_XMLProperty *pDelete;
  ON_XMLNodePrivate *this_01;
  recursive_mutex *__mutex_00;
  ChildIterator ci;
  PropertyIterator pi;
  ChildIterator local_50;
  PropertyIterator local_40;
  
  if (this == src) {
    return this;
  }
  __mutex = &this->_private->m_mutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  __mutex_00 = &src->_private->m_mutex;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex_00);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  this_01 = this->_private;
  pOVar2 = this_01->m_first_property;
  if (pOVar2 != (ON_XMLProperty *)0x0) {
    do {
      iVar1 = (*pOVar2->_vptr_ON_XMLProperty[5])(pOVar2);
      (*pOVar2->_vptr_ON_XMLProperty[1])(pOVar2);
      pOVar2 = (ON_XMLProperty *)CONCAT44(extraout_var,iVar1);
    } while ((ON_XMLProperty *)CONCAT44(extraout_var,iVar1) != (ON_XMLProperty *)0x0);
    this_01->m_first_property = (ON_XMLProperty *)0x0;
    this_01 = this->_private;
  }
  ON_XMLNodePrivate::RemoveAllChildren(this_01);
  ON_wString::operator=(&this->_private->m_name,&src->_private->m_name);
  (*src->_vptr_ON_XMLNode[0x2d])(&local_40,src,0);
  do {
    if ((local_40._private)->m_bSorted == true) {
      pOVar2 = ON_XMLNodePropertyIteratorPrivate::GetNextPropertySorted(local_40._private);
      if (pOVar2 == (ON_XMLProperty *)0x0) goto LAB_00683355;
    }
    else {
      pOVar2 = (local_40._private)->m_pCurrent;
      if (pOVar2 == (ON_XMLProperty *)0x0) {
LAB_00683355:
        (*src->_vptr_ON_XMLNode[0x2c])(&local_50,src);
        while (src_00 = (local_50._private)->_current, src_00 != (ON_XMLNode *)0x0) {
          (local_50._private)->_current = src_00->_private->m_next_sibling;
          this_00 = (ON_XMLNode *)operator_new(0xe8);
          ON_XMLNode(this_00,src_00);
          (*this->_vptr_ON_XMLNode[0xb])(this,this_00);
        }
        ChildIterator::~ChildIterator(&local_50);
        PropertyIterator::~PropertyIterator(&local_40);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex_00);
        pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        return this;
      }
      (local_40._private)->m_pCurrent = pOVar2->_private->_next;
    }
    ON_XMLNodePrivate::AddProperty(this->_private,pOVar2,true);
  } while( true );
}

Assistant:

const ON_XMLNode& ON_XMLNode::operator = (const ON_XMLNode& src)
{
  if (this == &src)
    return *this;

  std::lock_guard<std::recursive_mutex> lg1(_private->m_mutex);
  std::lock_guard<std::recursive_mutex> lg2(src._private->m_mutex);

  _private->RemoveAllProperties();
  _private->RemoveAllChildren();

  _private->m_name = src._private->m_name;

  // Copy in the properties.
  ON_XMLProperty* pProperty = nullptr;
  auto pi = src.GetPropertyIterator();
  while (nullptr != (pProperty = pi.GetNextProperty()))
  {
    _private->AddProperty(*pProperty, true);  //Add it to the end so that the order stays the same.
  }

  // Copy in the children.
  ON_XMLNode* pChild = nullptr;
  auto ci = src.GetChildIterator();
  while (nullptr != (pChild = ci.GetNextChild()))
  {
    AttachChildNode(new ON_XMLNode(*pChild));
  }

  return *this;
}